

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

void __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<duckdb::vector<unsigned_long,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<unsigned_long,_true> *ret)

{
  ulong uVar1;
  undefined8 in_RDX;
  undefined2 in_SI;
  Deserializer *in_RDI;
  vector<unsigned_long,_true> *in_stack_ffffffffffffffb0;
  Deserializer *this_00;
  
  this_00 = in_RDI;
  uVar1 = (*(code *)(((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &in_RDI->_vptr_Deserializer)->
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start[4])(in_RDI,in_SI,in_RDX,in_SI);
  if ((uVar1 & 1) == 0) {
    SerializationDefaultValue::GetDefault<duckdb::vector<unsigned_long,true>>();
    vector<unsigned_long,_true>::operator=
              (in_stack_ffffffffffffffb0,(vector<unsigned_long,_true> *)in_RDI);
    vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0xaedf6e);
    (*(code *)(((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&in_RDI->_vptr_Deserializer
               )->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[5])(in_RDI,0);
  }
  else {
    Read<duckdb::vector<unsigned_long,true>>(this_00);
    vector<unsigned_long,_true>::operator=
              (in_stack_ffffffffffffffb0,(vector<unsigned_long,_true> *)in_RDI);
    vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0xaedfa3);
    (*(code *)(((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&in_RDI->_vptr_Deserializer
               )->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[5])(in_RDI,1);
  }
  return;
}

Assistant:

inline void ReadPropertyWithDefault(const field_id_t field_id, const char *tag, T &ret) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(SerializationDefaultValue::GetDefault<T>());
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}